

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::v5::internal::
     parse_nonnegative_int<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>>&,wchar_t>&>
               (wchar_t **begin,wchar_t *end,
               width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>_&,_wchar_t>
               *eh)

{
  uint uVar1;
  long in_RSI;
  long *in_RDI;
  uint big;
  uint max_int;
  uint value;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar2;
  undefined4 local_24;
  undefined4 local_4;
  
  if (*(int *)*in_RDI == 0x30) {
    *in_RDI = *in_RDI + 4;
    local_4 = 0;
  }
  else {
    local_24 = 0;
    uVar1 = std::numeric_limits<int>::max();
    do {
      if (uVar1 / 10 < local_24) {
        local_24 = uVar1 + 1;
        uVar2 = in_stack_ffffffffffffffd0;
        break;
      }
      local_24 = local_24 * 10 + *(int *)*in_RDI + -0x30;
      *in_RDI = *in_RDI + 4;
      uVar2 = in_stack_ffffffffffffffd0 & 0xffffff;
      if ((*in_RDI != in_RSI) &&
         (uVar2 = in_stack_ffffffffffffffd0 & 0xffffff, 0x2f < *(int *)*in_RDI)) {
        uVar2 = CONCAT13(*(int *)*in_RDI < 0x3a,(int3)in_stack_ffffffffffffffd0);
      }
      in_stack_ffffffffffffffd0 = uVar2;
    } while ((char)(uVar2 >> 0x18) != '\0');
    if (uVar1 < local_24) {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>_&,_wchar_t>
      ::on_error((width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>_&,_wchar_t>
                  *)CONCAT44(uVar1 / 10,uVar2),in_stack_ffffffffffffffc8);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}